

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

bool sb_bmp_is_writable(filemgr *file,bid_t bid)

{
  long lVar1;
  bool bVar2;
  uint64_t uVar3;
  atomic<unsigned_long> *paVar4;
  __pointer_type bmp;
  uint64_t uVar5;
  atomic<unsigned_long> *paVar6;
  atomic<unsigned_long> *in_RSI;
  long in_RDI;
  uint8_t *sb_bmp;
  superblock *sb;
  uint64_t lw_bmp_revnum;
  bid_t last_commit;
  bool ret;
  memory_order in_stack_ffffffffffffff8c;
  atomic<unsigned_long> *in_stack_ffffffffffffff90;
  bool local_1;
  
  if (in_RSI < (atomic<unsigned_long> *)(ulong)*(byte *)**(undefined8 **)(in_RDI + 0x198)) {
    local_1 = true;
  }
  else {
    local_1 = false;
    uVar3 = atomic_get_uint64_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    paVar4 = (atomic<unsigned_long> *)(uVar3 / *(uint *)(in_RDI + 0x10));
    uVar3 = atomic_get_uint64_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    lVar1 = *(long *)(in_RDI + 0x198);
    sb_bmp_barrier_on((superblock *)0x18b2e1);
    bmp = std::atomic::operator_cast_to_unsigned_char_((atomic<unsigned_char_*> *)0x18b2ef);
    uVar5 = atomic_get_uint64_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    if (uVar5 == uVar3) {
      paVar6 = (atomic<unsigned_long> *)
               atomic_get_uint64_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      if (in_RSI < paVar6) {
        bVar2 = _is_bmp_set(bmp,(bid_t)in_RSI);
        if (((bVar2) &&
            (paVar6 = (atomic<unsigned_long> *)
                      atomic_get_uint64_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c),
            in_RSI < paVar6)) && (paVar4 <= in_RSI)) {
          local_1 = true;
        }
      }
      else {
        local_1 = paVar4 <= in_RSI;
      }
    }
    else {
      if (paVar4 <= in_RSI) {
        if (*(long *)(lVar1 + 0x48) == 0) {
          local_1 = true;
        }
        else {
          if ((in_RSI < *(atomic<unsigned_long> **)(lVar1 + 0x40)) &&
             (bVar2 = _is_bmp_set(*(uint8_t **)(lVar1 + 0x48),(bid_t)in_RSI), bVar2)) {
            local_1 = true;
          }
          paVar4 = (atomic<unsigned_long> *)
                   atomic_get_uint64_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
          if ((in_RSI < paVar4) && (bVar2 = _is_bmp_set(bmp,(bid_t)in_RSI), bVar2)) {
            local_1 = true;
          }
          paVar4 = (atomic<unsigned_long> *)
                   atomic_get_uint64_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
          if (paVar4 <= in_RSI) {
            local_1 = true;
          }
        }
      }
      paVar4 = (atomic<unsigned_long> *)
               atomic_get_uint64_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      if (((in_RSI < paVar4) &&
          (paVar4 = in_RSI,
          paVar6 = (atomic<unsigned_long> *)atomic_get_uint64_t(in_RSI,in_stack_ffffffffffffff8c),
          paVar4 < paVar6)) && (bVar2 = _is_bmp_set(bmp,(bid_t)in_RSI), bVar2)) {
        local_1 = true;
      }
    }
    sb_bmp_barrier_off((superblock *)0x18b4f0);
  }
  return local_1;
}

Assistant:

bool sb_bmp_is_writable(struct filemgr *file, bid_t bid)
{
    if (bid < file->sb->config->num_sb) {
        // superblocks are always writable
        return true;
    }

    bool ret = false;
    bid_t last_commit = atomic_get_uint64_t(&file->last_commit) / file->blocksize;
    uint64_t lw_bmp_revnum = atomic_get_uint64_t(&file->last_writable_bmp_revnum);
    struct superblock *sb = file->sb;

    sb_bmp_barrier_on(sb);

    uint8_t *sb_bmp = sb->bmp;
    if (atomic_get_uint64_t(&sb->bmp_revnum) == lw_bmp_revnum) {
        // Same bitmap revision number: there are 2 possible cases
        //
        // (1) normal case
        //               writable blocks
        //            <---->          <--->
        // +-------------------------------------------+
        // |       xxxxxxxxx          xxxxxxxxxx       | (x: reused blocks)
        // +-------------------------------------------+
        //            ^                   ^
        //            last_commit         cur_alloc
        //
        // (2) when file size grows after block reusing
        //                                   writable blocks
        //                             <------->       <--------->
        // +-------------------------------------------+---------+
        // |       xxxxxxxxx          xxxxxxxxxx       |         |
        // +-------------------------------------------+---------+
        //                             ^               ^         ^
        //                             last_commit     bmp_size  cur_alloc

        if (bid < atomic_get_uint64_t(&sb->bmp_size)) {
            // BID is in the bitmap .. check if bitmap is set.
            if (_is_bmp_set(sb_bmp, bid) &&
                bid < atomic_get_uint64_t(&sb->cur_alloc_bid) &&
                bid >= last_commit) {
                ret = true;
            }
        } else {
            // BID is out-of-range of the bitmap
            if (bid >= last_commit) {
                ret = true;
            }
        }
    } else {
        // Different bitmap revision number: there are also 2 possible cases
        //
        // (1) normal case
        //     writable blocks                 writable blocks
        //         <---->                          <--->
        // +-------------------------------------------+
        // |       xxxxxxxxx          xxxxxxxxxx       |
        // +-------------------------------------------+
        //              ^                          ^
        //              cur_alloc                  last_commit
        //
        // (2) when file size grows after block reusing
        //         writable blocks             writable blocks
        //      <---->       <------>      <-----------x--------->
        // +-------------------------------------------+---------+
        // |    xxxxxx       xxxxxxxx                  |         |
        // +-------------------------------------------+---------+
        //                                 ^           ^         ^
        //                                 last_commit bmp_size  cur_alloc

        // the block is writable if
        // 1) BID >= last_commit OR
        // 2) BID < cur_alloc_bid AND corresponding bitmap is set.
        if (bid >= last_commit) {
            // if prev_bmp exists, last commit position is still located on the
            // previous bitmap (since prev_bmp is released when a commit is invoked
            // in the new bitmap).
            // So in this case, we have to check both previous/current bitmaps.
            //
            // (1: previous bitmap (sb->bmp_prev), 2: current bitmap (sb->bmp))
            //
            //        writable blocks          writable blocks
            //    <-->      <---->   <-->          <> <> <>
            // +-------------------------------------------+
            // |  2222 1111 222222   2222   111111111 22 11|
            // +-------------------------------------------+
            //                                     ^
            //                                     last_commit
            if (sb->bmp_prev) {
                if (bid < sb->bmp_prev_size &&
                    _is_bmp_set(sb->bmp_prev, bid)) {
                    ret = true;
                }
                if (bid < atomic_get_uint64_t(&sb->bmp_size) &&
                    _is_bmp_set(sb_bmp, bid)) {
                    ret = true;
                }
                if (bid >= atomic_get_uint64_t(&sb->bmp_size)) {
                    // blocks newly allocated beyond the bitmap size:
                    // always writable
                    ret = true;
                }
            } else {
                // bmp_prev doesn't exist even though bmp_revnum is different
                // this happens on the first block reclaim only
                // so all blocks whose 'BID >= last_commit' are writable.
                ret = true;
            }
        }

        if (bid < atomic_get_uint64_t(&sb->bmp_size) &&
            bid < atomic_get_uint64_t(&sb->cur_alloc_bid) &&
            _is_bmp_set(sb_bmp, bid)) {
            // 'cur_alloc_bid' is always smaller than 'bmp_size'
            // except for the case 'cur_alloc_bid == BLK_NOT_FOUND'
            ret = true;
        }
    }

    sb_bmp_barrier_off(sb);

    return ret;
}